

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringWrapperExample.cpp
# Opt level: O1

ostream * toStringForMultipleLines(ostream *os,Rectangle3 *rectangle)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(x,y,width,height) = (",0x16);
  poVar1 = (ostream *)std::ostream::operator<<(os,rectangle->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream& toStringForMultipleLines(std::ostream& os, const Rectangle3& rectangle)
{
    os << "(x,y,width,height) = (" << rectangle.x << "," << rectangle.y << ","
       << rectangle.width << "," << rectangle.height << ")";
    return os;
}